

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

int csguide_webserver::CheckBasePath(string *base_path)

{
  int iVar1;
  Logger *pLVar2;
  stat file;
  string local_c8;
  stat local_a8;
  
  iVar1 = stat((base_path->_M_dataplus)._M_p,&local_a8);
  if (iVar1 == -1) {
    pLVar2 = Logger::GetInstance();
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"path not exist: %s","");
    Logger::Log<char_const*>(pLVar2,ERROR,&local_c8,(base_path->_M_dataplus)._M_p);
  }
  else {
    if (((local_a8.st_mode & 0xf000) == 0x4000) &&
       (iVar1 = access((base_path->_M_dataplus)._M_p,4), iVar1 != -1)) {
      return 0;
    }
    pLVar2 = Logger::GetInstance();
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"path not directory or can\'t access: %s","");
    Logger::Log<char_const*>(pLVar2,ERROR,&local_c8,(base_path->_M_dataplus)._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return -1;
}

Assistant:

int CheckBasePath(const std::string &base_path) {
  struct stat file;
  if (stat(base_path.c_str(), &file) == -1) {
    Logger::GetInstance().LogErr("path not exist: %s", base_path.c_str());
    return -1;
  }
  // 不是目录 或者不可访问
  if (!S_ISDIR(file.st_mode) || access(base_path.c_str(), R_OK) == -1) {
    Logger::GetInstance().LogErr("path not directory or can't access: %s", base_path.c_str());
    return -1;
  }
  return 0;
}